

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::FOREACH_OP(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *o3,SQObjectPtr *o4,
                SQInteger arg_2,int exitpos,int *jump)

{
  int iVar1;
  byte bVar2;
  undefined1 uVar3;
  SQInteger SVar4;
  SQObjectPtr *obj;
  SQChar *pSVar5;
  SQObjectPtr *in_RCX;
  SQClass *in_RDX;
  int *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *in_R8;
  SQVM *in_R9;
  undefined4 in_stack_00000008;
  undefined4 *in_stack_00000010;
  SQInteger idx;
  SQObjectPtr closure;
  SQObjectPtr itr;
  SQInteger nrefidx;
  SQObjectPtr *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  SQObjectPtr *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff80;
  SQObjectPtr *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SQTable *in_stack_ffffffffffffff98;
  SQInteger in_stack_ffffffffffffffa0;
  SQObjectValue in_stack_ffffffffffffffa8;
  SQObjectType in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQObjectValue in_stack_ffffffffffffffb8;
  SQVM *in_stack_ffffffffffffffc0;
  bool local_1;
  
  iVar1 = *in_RSI;
  if (iVar1 == 0x8000010) {
    SVar4 = SQString::Next((SQString *)in_RDI,
                           (SQObjectPtr *)
                           CONCAT17(in_stack_ffffffffffffff77,
                                    CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                           in_stack_ffffffffffffff68,
                           (SQObjectPtr *)
                           CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    if (SVar4 != -1) {
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (SQInteger)in_stack_ffffffffffffff58);
      *in_stack_00000010 = 1;
      return true;
    }
    *in_stack_00000010 = in_stack_00000008;
    return true;
  }
  if (iVar1 == 0x8000040) {
    SVar4 = SQArray::Next((SQArray *)in_stack_ffffffffffffff98,
                          (SQObjectPtr *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88,
                          (SQObjectPtr *)CONCAT44(0x8000040,in_stack_ffffffffffffff80));
    if (SVar4 != -1) {
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (SQInteger)in_stack_ffffffffffffff58);
      *in_stack_00000010 = 1;
      return true;
    }
    *in_stack_00000010 = in_stack_00000008;
    return true;
  }
  if (iVar1 == 0x8000400) {
    if (*(int *)(*(long *)(in_RSI + 2) + 0xb8) == 2) {
      *in_stack_00000010 = in_stack_00000008;
      return true;
    }
    if (*(int *)(*(long *)(in_RSI + 2) + 0xb8) == 1) {
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (SQInteger)in_stack_ffffffffffffff58);
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (SQInteger)in_stack_ffffffffffffff58);
      SQGenerator::Resume((SQGenerator *)in_R9,in_stack_ffffffffffffffc0,
                          (SQObjectPtr *)in_stack_ffffffffffffffb8.pTable);
      *in_stack_00000010 = 0;
      return true;
    }
  }
  else {
    if (iVar1 == 0x8004000) {
      SVar4 = SQClass::Next(in_RDX,in_RCX,in_R8,(SQObjectPtr *)in_R9);
      if (SVar4 != -1) {
        ::SQObjectPtr::operator=
                  ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                   (SQInteger)in_stack_ffffffffffffff58);
        *in_stack_00000010 = 1;
        return true;
      }
      *in_stack_00000010 = in_stack_00000008;
      return true;
    }
    if (iVar1 == 0xa000020) {
      SVar4 = SQTable::Next(in_stack_ffffffffffffff98,
                            SUB41((uint)in_stack_ffffffffffffff94 >> 0x18,0),
                            in_stack_ffffffffffffff88,
                            (SQObjectPtr *)CONCAT44(0xa000020,in_stack_ffffffffffffff80),
                            (SQObjectPtr *)in_RDI);
      if (SVar4 != -1) {
        ::SQObjectPtr::operator=
                  ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                   (SQInteger)in_stack_ffffffffffffff58);
        *in_stack_00000010 = 1;
        return true;
      }
      *in_stack_00000010 = in_stack_00000008;
      return true;
    }
    if ((iVar1 == 0xa000080) || (iVar1 == 0xa008000)) {
      if (*(long *)(*(long *)(in_RSI + 2) + 0x30) == 0) {
        return false;
      }
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb0);
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa0);
      bVar2 = (**(code **)(**(long **)(in_RSI + 2) + 0x30))
                        (*(long **)(in_RSI + 2),in_RDI,9,&stack0xffffffffffffffa0);
      if ((bVar2 & 1) == 0) {
        Raise_Error(in_RDI,"_nexti failed");
        local_1 = false;
      }
      else {
        Push((SQVM *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
        Push((SQVM *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
        uVar3 = CallMetaMethod(in_RDI,(SQObjectPtr *)
                                      CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff76,
                                                              in_stack_ffffffffffffff70)),
                               (SQMetaMethod)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff58);
        if ((bool)uVar3) {
          obj = ::SQObjectPtr::operator=
                          ((SQObjectPtr *)CONCAT17(bVar2,CONCAT16(uVar3,in_stack_ffffffffffffff70)),
                           in_stack_ffffffffffffff68);
          ::SQObjectPtr::operator=
                    ((SQObjectPtr *)CONCAT17(bVar2,CONCAT16(uVar3,in_stack_ffffffffffffff70)),obj);
          if (in_stack_ffffffffffffffb0 == OT_NULL) {
            *in_stack_00000010 = in_stack_00000008;
            local_1 = true;
          }
          else {
            in_stack_ffffffffffffff67 =
                 Get(in_R9,(SQObjectPtr *)in_stack_ffffffffffffffc0,
                     (SQObjectPtr *)in_stack_ffffffffffffffb8.pTable,
                     (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8.nInteger,in_stack_ffffffffffffffa0);
            if ((bool)in_stack_ffffffffffffff67) {
              *in_stack_00000010 = 1;
              local_1 = true;
            }
            else {
              Raise_Error(in_RDI,"_nexti returned an invalid idx");
              local_1 = false;
            }
          }
        }
        else {
          local_1 = false;
        }
      }
      ::SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      ::SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      return local_1;
    }
  }
  pSVar5 = GetTypeName((SQObjectPtr *)0x1312f2);
  Raise_Error(in_RDI,"cannot iterate %s",pSVar5);
  return false;
}

Assistant:

bool SQVM::FOREACH_OP(SQObjectPtr &o1,SQObjectPtr &o2,SQObjectPtr
&o3,SQObjectPtr &o4,SQInteger SQ_UNUSED_ARG(arg_2),int exitpos,int &jump)
{
    SQInteger nrefidx;
    switch(sq_type(o1)) {
    case OT_TABLE:
        if((nrefidx = _table(o1)->Next(false,o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_ARRAY:
        if((nrefidx = _array(o1)->Next(o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger) nrefidx; _FINISH(1);
    case OT_STRING:
        if((nrefidx = _string(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_CLASS:
        if((nrefidx = _class(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o1)->_delegate) {
            SQObjectPtr itr;
            SQObjectPtr closure;
            if(_delegable(o1)->GetMetaMethod(this, MT_NEXTI, closure)) {
                Push(o1);
                Push(o4);
                if(CallMetaMethod(closure, MT_NEXTI, 2, itr)) {
                    o4 = o2 = itr;
                    if(sq_type(itr) == OT_NULL) _FINISH(exitpos);
                    if(!Get(o1, itr, o3, 0, DONT_FALL_BACK)) {
                        Raise_Error(_SC("_nexti returned an invalid idx")); // cloud be changed
                        return false;
                    }
                    _FINISH(1);
                }
                else {
                    return false;
                }
            }
            Raise_Error(_SC("_nexti failed"));
            return false;
        }
        break;
    case OT_GENERATOR:
        if(_generator(o1)->_state == SQGenerator::eDead) _FINISH(exitpos);
        if(_generator(o1)->_state == SQGenerator::eSuspended) {
            SQInteger idx = 0;
            if(sq_type(o4) == OT_INTEGER) {
                idx = _integer(o4) + 1;
            }
            o2 = idx;
            o4 = idx;
            _generator(o1)->Resume(this, o3);
            _FINISH(0);
        }
    default:
        Raise_Error(_SC("cannot iterate %s"), GetTypeName(o1));
    }
    return false; //cannot be hit(just to avoid warnings)
}